

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view externalName,SourceLocation externalLoc,
          PortReferenceSyntax *syntax)

{
  char *pcVar1;
  Scope *this_00;
  Compilation *this_01;
  ExpressionSyntax *pEVar2;
  uint uVar3;
  byte bVar4;
  char *pcVar5;
  string_view arg;
  NonAnsiPortListBuilder *pNVar6;
  size_t __n;
  int iVar7;
  uint uVar8;
  uint64_t uVar9;
  Diagnostic *pDVar10;
  PortSymbol *pPVar11;
  InterfacePortSymbol *symbol;
  SourceLocation SVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  size_type __rlen;
  long lVar16;
  undefined1 auVar17 [16];
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  byte bVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  byte bVar33;
  SourceRange sourceRange;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  LookupLocation lookupLocation;
  SourceLocation loc;
  string_view name;
  size_t pos;
  value_type *elements;
  bool local_c9;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  NonAnsiPortListBuilder *local_b8;
  SourceLocation local_b0;
  string_view local_a8;
  PortReferenceSyntax *local_98;
  SourceLocation local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  long local_68;
  SourceLocation local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  local_c8._M_str = externalName._M_str;
  local_c8._M_len = externalName._M_len;
  local_90 = externalLoc;
  local_60 = externalLoc;
  local_a8 = parsing::Token::valueText(&syntax->name);
  if ((externalName._M_len == 0) && (syntax->select == (ElementSelectSyntax *)0x0)) {
    local_c8._M_len = local_a8._M_len;
    local_c8._M_str = local_a8._M_str;
  }
  local_98 = syntax;
  uVar9 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                     &(this->portInfos).super_Storage.field_0x2c8,&local_a8);
  uVar13 = uVar9 >> ((this->portInfos).field_0x2d0 & 0x3f);
  local_70 = *(long *)&(this->portInfos).field_0x2e0;
  lVar14 = (uVar9 & 0xff) * 4;
  cVar18 = (&UNK_0047072c)[lVar14];
  cVar19 = (&UNK_0047072d)[lVar14];
  cVar20 = (&UNK_0047072e)[lVar14];
  bVar21 = (&UNK_0047072f)[lVar14];
  local_68 = *(long *)&(this->portInfos).field_0x2e8;
  __n = local_a8._M_len;
  pcVar5 = local_a8._M_str;
  local_78 = (ulong)((uint)uVar9 & 7);
  local_80 = *(ulong *)&(this->portInfos).field_0x2d8;
  uVar15 = 0;
  cVar22 = cVar18;
  cVar23 = cVar19;
  cVar24 = cVar20;
  bVar25 = bVar21;
  cVar26 = cVar18;
  cVar27 = cVar19;
  cVar28 = cVar20;
  bVar29 = bVar21;
  cVar30 = cVar18;
  cVar31 = cVar19;
  cVar32 = cVar20;
  bVar33 = bVar21;
  local_b8 = this;
  do {
    pcVar1 = (char *)(local_70 + uVar13 * 0x10);
    local_48 = *pcVar1;
    cStack_47 = pcVar1[1];
    cStack_46 = pcVar1[2];
    bStack_45 = pcVar1[3];
    cStack_44 = pcVar1[4];
    cStack_43 = pcVar1[5];
    cStack_42 = pcVar1[6];
    bStack_41 = pcVar1[7];
    cStack_40 = pcVar1[8];
    cStack_3f = pcVar1[9];
    cStack_3e = pcVar1[10];
    bStack_3d = pcVar1[0xb];
    cStack_3c = pcVar1[0xc];
    cStack_3b = pcVar1[0xd];
    cStack_3a = pcVar1[0xe];
    bVar4 = pcVar1[0xf];
    auVar17[0] = -(local_48 == cVar18);
    auVar17[1] = -(cStack_47 == cVar19);
    auVar17[2] = -(cStack_46 == cVar20);
    auVar17[3] = -(bStack_45 == bVar21);
    auVar17[4] = -(cStack_44 == cVar22);
    auVar17[5] = -(cStack_43 == cVar23);
    auVar17[6] = -(cStack_42 == cVar24);
    auVar17[7] = -(bStack_41 == bVar25);
    auVar17[8] = -(cStack_40 == cVar26);
    auVar17[9] = -(cStack_3f == cVar27);
    auVar17[10] = -(cStack_3e == cVar28);
    auVar17[0xb] = -(bStack_3d == bVar29);
    auVar17[0xc] = -(cStack_3c == cVar30);
    auVar17[0xd] = -(cStack_3b == cVar31);
    auVar17[0xe] = -(cStack_3a == cVar32);
    auVar17[0xf] = -(bVar4 == bVar33);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    local_88 = uVar13;
    bStack_39 = bVar4;
    if (uVar8 != 0) {
      lVar14 = local_68 + uVar13 * 0x528;
      local_58 = cVar18;
      cStack_57 = cVar19;
      cStack_56 = cVar20;
      bStack_55 = bVar21;
      cStack_54 = cVar22;
      cStack_53 = cVar23;
      cStack_52 = cVar24;
      bStack_51 = bVar25;
      cStack_50 = cVar26;
      cStack_4f = cVar27;
      cStack_4e = cVar28;
      bStack_4d = bVar29;
      cStack_4c = cVar30;
      cStack_4b = cVar31;
      cStack_4a = cVar32;
      bStack_49 = bVar33;
      do {
        uVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        lVar16 = (ulong)uVar3 * 0x58;
        if ((__n == *(size_t *)(lVar14 + lVar16)) &&
           ((__n == 0 ||
            (iVar7 = bcmp(pcVar5,*(void **)(lVar14 + 8 + lVar16),__n), cVar18 = local_58,
            cVar19 = cStack_57, cVar20 = cStack_56, bVar21 = bStack_55, cVar22 = cStack_54,
            cVar23 = cStack_53, cVar24 = cStack_52, bVar25 = bStack_51, cVar26 = cStack_50,
            cVar27 = cStack_4f, cVar28 = cStack_4e, bVar29 = bStack_4d, cVar30 = cStack_4c,
            cVar31 = cStack_4b, cVar32 = cStack_4a, bVar33 = bStack_49, iVar7 == 0)))) {
          lVar14 = lVar14 + lVar16;
          *(undefined1 *)(lVar14 + 0x54) = 1;
          local_b0 = parsing::Token::location((Token *)(*(long *)(lVar14 + 0x10) + 0x18));
          pNVar6 = local_b8;
          if (*(char *)(lVar14 + 0x55) != '\x01') {
            local_c9 = false;
            pPVar11 = BumpAllocator::
                      emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                                (&local_b8->comp->super_BumpAllocator,&local_c8,&local_b0,&local_c9)
            ;
            (pPVar11->super_Symbol).originatingSyntax = (SyntaxNode *)local_98;
            pPVar11->externalLoc = local_90;
            pPVar11->direction = *(ArgumentDirection *)(lVar14 + 0x50);
            pPVar11->internalSymbol = *(Symbol **)(lVar14 + 0x28);
            lVar14 = *(long *)(*(long *)(lVar14 + 0x10) + 0x60);
            if (lVar14 == 0) {
              return &pPVar11->super_Symbol;
            }
            pEVar2 = *(ExpressionSyntax **)(lVar14 + 0x28);
            SVar12 = parsing::Token::location((Token *)(lVar14 + 0x18));
            pPVar11->initializerSyntax = pEVar2;
            pPVar11->initializerLoc = SVar12;
            return &pPVar11->super_Symbol;
          }
          if (local_c8._M_len == 0) {
            local_c8._M_len = local_a8._M_len;
            local_c8._M_str = local_a8._M_str;
          }
          if (local_98->select != (ElementSelectSyntax *)0x0) {
            this_00 = local_b8->scope;
            sourceRange = slang::syntax::SyntaxNode::sourceRange
                                    (&local_98->select->super_SyntaxNode);
            pDVar10 = Scope::addDiag(this_00,(DiagCode)0x450006,sourceRange);
            arg._M_str = local_c8._M_str;
            arg._M_len = local_c8._M_len;
            Diagnostic::operator<<(pDVar10,arg);
          }
          symbol = BumpAllocator::
                   emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
                             (&pNVar6->comp->super_BumpAllocator,&local_c8,&local_b0);
          (symbol->super_Symbol).originatingSyntax = *(SyntaxNode **)(lVar14 + 0x10);
          symbol->interfaceDef = *(DefinitionSymbol **)(lVar14 + 0x38);
          pcVar5 = *(char **)(lVar14 + 0x48);
          (symbol->modport)._M_len = *(size_t *)(lVar14 + 0x40);
          (symbol->modport)._M_str = pcVar5;
          if (*(long *)(lVar14 + 0x30) == 0) {
            return &symbol->super_Symbol;
          }
          this_01 = pNVar6->comp;
          lookupLocation.index = *(undefined4 *)(*(long *)(lVar14 + 0x30) + 0x30);
          lookupLocation.scope = pNVar6->scope;
          lookupLocation._12_4_ = 0;
          attributes = AttributeSymbol::fromSyntax
                                 (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                    *)(lVar14 + 0x18),pNVar6->scope,lookupLocation);
          Compilation::setAttributes(this_01,&symbol->super_Symbol,attributes);
          return &symbol->super_Symbol;
        }
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
    }
    pNVar6 = local_b8;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_78] & bVar4) == 0) break;
    lVar14 = local_88 + uVar15;
    uVar15 = uVar15 + 1;
    uVar13 = lVar14 + 1U & local_80;
  } while (uVar15 <= local_80);
  if (__n != 0) {
    pDVar10 = Scope::addDiag(local_b8->scope,(DiagCode)0x7e0006,local_90);
    Diagnostic::operator<<(pDVar10,local_a8);
  }
  local_b0 = (SourceLocation)((ulong)local_b0 & 0xffffffffffffff00);
  pPVar11 = BumpAllocator::
            emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                      (&pNVar6->comp->super_BumpAllocator,&local_c8,&local_60,(bool *)&local_b0);
  pPVar11->type = pNVar6->comp->errorType;
  return &pPVar11->super_Symbol;
}

Assistant:

Symbol& createPort(std::string_view externalName, SourceLocation externalLoc,
                       const PortReferenceSyntax& syntax) {
        auto name = syntax.name.valueText();
        if (externalName.empty() && !syntax.select)
            externalName = name;

        auto it = portInfos.find(name);
        if (it == portInfos.end()) {
            if (!name.empty())
                scope.addDiag(diag::MissingPortIODeclaration, externalLoc) << name;

            auto port = comp.emplace<PortSymbol>(externalName, externalLoc, /* isAnsiPort */ false);
            port->setType(comp.getErrorType());
            return *port;
        }

        auto& info = it->second;
        info.used = true;

        auto loc = info.syntax->name.location();
        if (info.isIface) {
            // Interface ports should not have empty names. We'll be ignoring the
            // select if there is one (along with issuing an error) so just set the name.
            if (externalName.empty())
                externalName = name;

            if (syntax.select) {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, syntax.select->sourceRange());
                diag << externalName;
            }

            auto port = comp.emplace<InterfacePortSymbol>(externalName, loc);
            port->setSyntax(*info.syntax);
            port->interfaceDef = info.ifaceDef;
            port->modport = info.modport;

            if (info.insertionPoint) {
                comp.setAttributes(
                    *port, AttributeSymbol::fromSyntax(
                               info.attrs, scope,
                               LookupLocation(&scope, (uint32_t)info.insertionPoint->getIndex())));
            }

            return *port;
        }

        auto port = comp.emplace<PortSymbol>(externalName, loc, /* isAnsiPort */ false);
        port->setSyntax(syntax);
        port->externalLoc = externalLoc;

        SLANG_ASSERT(info.internalSymbol);
        port->direction = info.direction;
        port->internalSymbol = info.internalSymbol;

        if (auto init = info.syntax->initializer)
            port->setInitializerSyntax(*init->expr, init->equals.location());

        return *port;
    }